

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long *plVar1;
  Vector *result_00;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  idx_t i;
  idx_t iVar5;
  idx_t iVar6;
  long lVar7;
  idx_t in_R8;
  long *plVar8;
  idx_t i_1;
  ulong uVar9;
  string_t value;
  UnifiedVectorFormat sdata;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  result_00 = (Vector *)duckdb::ListVector::GetListSize(result);
  lVar7 = 0;
  for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
    iVar6 = iVar5;
    if (*local_78 != 0) {
      iVar6 = (idx_t)*(uint *)(*local_78 + iVar5 * 4);
    }
    lVar4 = **(long **)(local_70 + iVar6 * 8);
    if (lVar4 != 0) {
      lVar7 = lVar7 + *(long *)(lVar4 + 0x20);
    }
  }
  duckdb::ListVector::Reserve(result,(ulong)(result_00 + lVar7));
  uVar2 = duckdb::ListVector::GetEntry(result);
  lVar7 = *(long *)(result + 0x20);
  for (uVar9 = 0; uVar9 != count; uVar9 = uVar9 + 1) {
    uVar3 = uVar9;
    if (*local_78 != 0) {
      uVar3 = (ulong)*(uint *)(*local_78 + uVar9 * 4);
    }
    plVar8 = *(long **)(local_70 + uVar3 * 8);
    plVar1 = (long *)(lVar7 + uVar9 * 0x10);
    *(Vector **)(lVar7 + uVar9 * 0x10) = result_00;
    lVar4 = *plVar8;
    if (lVar4 == 0) {
      lVar4 = 0;
    }
    else {
      plVar8 = (long *)(lVar4 + 0x18);
      while (plVar8 = (long *)*plVar8, plVar8 != (long *)0x0) {
        value.value.pointer.ptr = (char *)uVar2;
        value.value._0_8_ = plVar8[2];
        FinalizeStringValueFunctor::HistogramFinalize<duckdb::string_t>
                  ((FinalizeStringValueFunctor *)plVar8[1],value,result_00,in_R8);
        result_00 = result_00 + 1;
      }
      lVar4 = (long)result_00 - *plVar1;
    }
    plVar1[1] = lVar4;
  }
  duckdb::ListVector::SetListSize(result,(ulong)result_00);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}